

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FLog.cpp
# Opt level: O0

void FLog::mInfo(time_t dateTime,int line,string *function,string *file,string *text)

{
  id __id;
  char *pcVar1;
  long lVar2;
  ostream *this;
  allocator<char> local_5d9;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  allocator<char> local_551;
  string local_550;
  Log local_530;
  undefined1 local_490 [8];
  mutex locker;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined1 local_228 [8];
  string temp;
  undefined1 local_200 [8];
  string timeTemp;
  string threadIdStr;
  ostringstream local_1a8 [8];
  ostringstream sstream;
  string *text_local;
  string *file_local;
  string *function_local;
  time_t tStack_10;
  int line_local;
  time_t dateTime_local;
  
  tStack_10 = dateTime;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  __id = std::this_thread::get_id();
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,__id);
  std::__cxx11::ostringstream::str();
  if (logLevel == all) {
    if ((printInfo & 1U) != 0 || (printAll & 1U) != 0) {
      pcVar1 = ctime(&stack0xfffffffffffffff0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_200,pcVar1,(allocator<char> *)(temp.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(temp.field_2._M_local_buf + 0xf));
      lVar2 = std::__cxx11::string::size();
      std::__cxx11::string::replace((ulong)local_200,lVar2 - 1,(char *)0x1);
      std::operator+(&local_448," [DateTime: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200)
      ;
      std::operator+(&local_428,&local_448," ] ");
      std::operator+(&local_408,&local_428," [Type: Info    ] ");
      std::operator+(&local_3e8,&local_408," [Line: ");
      std::__cxx11::to_string
                ((string *)&locker.super___mutex_base._M_mutex.__data.__list.__next,line);
      std::operator+(&local_3c8,&local_3e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &locker.super___mutex_base._M_mutex.__data.__list.__next);
      std::operator+(&local_3a8,&local_3c8," ] ");
      std::operator+(&local_388,&local_3a8," [Function: ");
      std::operator+(&local_368,&local_388,function);
      std::operator+(&local_348,&local_368," ] ");
      std::operator+(&local_328,&local_348," [Thread Id: ");
      std::operator+(&local_308,&local_328,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&timeTemp.field_2 + 8));
      std::operator+(&local_2e8,&local_308," ] ");
      std::operator+(&local_2c8,&local_2e8," [File: ");
      std::operator+(&local_2a8,&local_2c8,file);
      std::operator+(&local_288,&local_2a8," ] ");
      std::operator+(&local_268,&local_288," [MSG: ");
      std::operator+(&local_248,&local_268,text);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                     &local_248," ] ");
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::string::~string((string *)&local_388);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string
                ((string *)&locker.super___mutex_base._M_mutex.__data.__list.__next);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_408);
      std::__cxx11::string::~string((string *)&local_428);
      std::__cxx11::string::~string((string *)&local_448);
      std::mutex::mutex((mutex *)local_490);
      std::mutex::lock((mutex *)local_490);
      this = std::operator<<((ostream *)&std::clog,(string *)local_228);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      std::mutex::unlock((mutex *)local_490);
      std::__cxx11::string::~string((string *)local_228);
      std::__cxx11::string::~string((string *)local_200);
    }
    pcVar1 = ctime(&stack0xfffffffffffffff0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_550,pcVar1,&local_551);
    std::__cxx11::to_string(&local_578,line);
    std::__cxx11::string::string((string *)&local_598,(string *)file);
    std::__cxx11::string::string((string *)&local_5b8,(string *)text);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d8,"info",&local_5d9);
    FONQRI::Log::Log(&local_530,&local_550,&local_578,&local_598,&local_5b8,&local_5d8);
    std::vector<FONQRI::Log,_std::allocator<FONQRI::Log>_>::push_back(&normalLogList,&local_530);
    FONQRI::Log::~Log(&local_530);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::allocator<char>::~allocator(&local_5d9);
    std::__cxx11::string::~string((string *)&local_5b8);
    std::__cxx11::string::~string((string *)&local_598);
    std::__cxx11::string::~string((string *)&local_578);
    std::__cxx11::string::~string((string *)&local_550);
    std::allocator<char>::~allocator(&local_551);
    std::vector<FONQRI::Log,_std::allocator<FONQRI::Log>_>::size(&normalLogList);
  }
  std::__cxx11::string::~string((string *)(timeTemp.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return;
}

Assistant:

void FLog::mInfo(const time_t dateTime, int line, std::string function,
		 std::string file, std::string text)
{
	// get thread id and convert it to string
	std::ostringstream sstream;
	sstream << std::this_thread::get_id();
	std::string threadIdStr = sstream.str();

	if (logLevel == FLog::all) {
		if (FLog::printInfo | FLog::printAll) {
			std::string timeTemp = std::string(std::ctime(&dateTime));
			timeTemp.replace(timeTemp.size() - 1, 1, "");
			std::string temp = " [DateTime: " + timeTemp + " ] " +
					   " [Type: Info    ] " + " [Line: " +
					   std::to_string(line) + " ] " +
					   " [Function: " + function + " ] " +
					   " [Thread Id: " + threadIdStr + " ] " +
					   " [File: " + file + " ] " + " [MSG: " +
					   text + " ] ";
			std::mutex locker;
			locker.lock();
			std::clog << temp << std::endl;
			locker.unlock();
		}
		FLog::normalLogList.push_back(
		FONQRI::Log(std::string(std::ctime(&dateTime)),
				std::to_string(line), file, text, "info"));

		if (FLog::normalLogList.size() >= FLog::logCounts) {
			// NOTE you can save save normalLogList  to database
		}
	}
}